

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

Info * __thiscall
SpecificStrategy::extractInfo(Info *__return_storage_ptr__,SpecificStrategy *this,CFG *cfg)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  *__return_storage_ptr___00;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  CfgData data;
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  local_1a0;
  Edge local_170;
  CfgData local_158;
  
  Info::Info(__return_storage_ptr__);
  CfgData::CfgData(&local_158,cfg);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)__return_storage_ptr__,&local_158.m_instrs._M_t);
  std::
  _Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
  ::operator=((_Rb_tree<CfgData::Node,_CfgData::Node,_std::_Identity<CfgData::Node>,_std::less<CfgData::Node>,_std::allocator<CfgData::Node>_>
               *)&__return_storage_ptr__->blocks,&local_158.m_blocks._M_t);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=(&(__return_storage_ptr__->phantoms)._M_t,&local_158.m_phantoms._M_t);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::_Rb_tree(&local_1a0,&local_158.m_edges._M_t);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::operator=((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
               *)&(__return_storage_ptr__->edges).external,&local_1a0);
  std::
  _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
  ::~_Rb_tree(&local_1a0);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::_Rb_tree((_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
              *)&local_1a0,&local_158.m_calls._M_t);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::operator=(&(__return_storage_ptr__->calls)._M_t,
              (_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
               *)&local_1a0);
  std::
  _Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
  ::~_Rb_tree((_Rb_tree<CfgData::Call,_CfgData::Call,_std::_Identity<CfgData::Call>,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
               *)&local_1a0);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::operator=(&(__return_storage_ptr__->indirects)._M_t,&local_158.m_indirects._M_t);
  __return_storage_ptr___00 = &local_1a0;
  CFG::nodes_abi_cxx11_
            ((list<CfgNode_*,_std::allocator<CfgNode_*>_> *)__return_storage_ptr___00,cfg);
  while (__return_storage_ptr___00 =
              *(_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                **)&__return_storage_ptr___00->_M_impl, __return_storage_ptr___00 != &local_1a0) {
    p_Var2 = (__return_storage_ptr___00->_M_impl).super__Rb_tree_header._M_header._M_parent;
    if (*(int *)&p_Var2->_M_parent == 1) {
      pp_Var4 = &p_Var2->_M_left->_M_right;
      p_Var2 = (_Base_ptr)pp_Var4;
      p_Var1 = (_Base_ptr)0x0;
      while (p_Var3 = p_Var1, p_Var2 = *(_Base_ptr *)p_Var2, p_Var2 != (_Base_ptr)pp_Var4) {
        p_Var1 = p_Var2->_M_left;
        if (p_Var3 != (_Base_ptr)0x0) {
          local_170.from = (Addr)p_Var3->_M_parent;
          local_170.to = (Addr)p_Var1->_M_parent;
          local_170._vptr_Edge = (_func_int **)&PTR__Edge_00118b18;
          std::
          _Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
          ::_M_insert_unique<CfgData::Edge>
                    ((_Rb_tree<CfgData::Edge,_CfgData::Edge,_std::_Identity<CfgData::Edge>,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                      *)&__return_storage_ptr__->edges,&local_170);
        }
      }
    }
  }
  std::__cxx11::_List_base<CfgNode_*,_std::allocator<CfgNode_*>_>::_M_clear
            ((_List_base<CfgNode_*,_std::allocator<CfgNode_*>_> *)&local_1a0);
  CfgData::~CfgData(&local_158);
  return __return_storage_ptr__;
}

Assistant:

SpecificStrategy::Info SpecificStrategy::extractInfo(CFG* cfg) {
	SpecificStrategy::Info info;

	CfgData data(cfg);
	info.instrs = data.instrs();
	info.blocks.perfect = data.blocks();
	info.phantoms = data.phantoms();
	info.edges.external.perfect = data.edges();
	info.calls = data.calls();
	info.indirects = data.indirects();

	for (CfgNode* node : cfg->nodes()) {
		if (node->type() != CfgNode::CFG_BLOCK)
			continue;

		CfgNode::BlockData* block = static_cast<CfgNode::BlockData*>(node->data());
		Instruction* previous = 0;
		for (Instruction* instr : block->instructions()) {
			if (previous != 0)
				info.edges.internal.perfect.insert(CfgData::Edge(previous->addr(), instr->addr()));

			previous = instr;
		}
	}

	return info;
}